

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int u8_to_hex(uint8_t *in,int in_len,uint8_t *out)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = 0;
  if (out != (uint8_t *)0x0 && in != (uint8_t *)0x0) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)in_len;
    if (in_len < 1) {
      uVar3 = uVar2;
    }
    iVar1 = 1;
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      out[uVar2 * 2] = "0123456789abcdef"[in[uVar2] >> 4];
      out[uVar2 * 2 + 1] = "0123456789abcdef"[in[uVar2] & 0xf];
    }
  }
  return iVar1;
}

Assistant:

int u8_to_hex(const uint8_t *in, int in_len, uint8_t *out)
{
    if (in == NULL || out == NULL)
        return GML_ERROR;

    for (int i = 0; i < in_len; i++) {
        out[0] = ascii_table[in[i] >> 4];
        out[1] = ascii_table[in[i] & 0xf];
        out += 2;
    }
    return GML_OK;
}